

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O3

void __thiscall tonk::ReceiverStatistics::Decompress(ReceiverStatistics *this,uint8_t *buffer)

{
  this->LossRate = (float)*buffer * 0.00390625;
  this->GoodputBPS = (*(ushort *)(buffer + 1) & 0x7ff) << (*(ushort *)(buffer + 1) >> 0xb);
  this->TripUsec = (*(ushort *)(buffer + 3) & 0x7ff) << (*(ushort *)(buffer + 3) >> 0xb);
  return;
}

Assistant:

void ReceiverStatistics::Decompress(const uint8_t* buffer)
{
    LossRate = static_cast<int>(buffer[0]) / 256.f;
    GoodputBPS = FixedPointDecompress16to32(siamese::ReadU16_LE(buffer + 1));
    TripUsec = FixedPointDecompress16to32(siamese::ReadU16_LE(buffer + 3));
}